

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixVfs_getcwd(jx9_context *pCtx)

{
  char *zString;
  char *zDir;
  char zBuf [4096];
  jx9_context *pCtx_local;
  
  zBuf._4088_8_ = pCtx;
  zString = getcwd((char *)&zDir,0x1000);
  if (zString == (char *)0x0) {
    pCtx_local._4_4_ = -1;
  }
  else {
    jx9_result_string((jx9_context *)zBuf._4088_8_,zString,-1);
    pCtx_local._4_4_ = 0;
  }
  return pCtx_local._4_4_;
}

Assistant:

static int UnixVfs_getcwd(jx9_context *pCtx)
{
	char zBuf[4096];
	char *zDir;
	/* Get the current directory */
	zDir = getcwd(zBuf, sizeof(zBuf));
	if( zDir == 0 ){
	  return -1;
    }
	jx9_result_string(pCtx, zDir, -1/*Compute length automatically*/);
	return JX9_OK;
}